

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  char *in_RCX;
  char *data;
  int in_EDX;
  int sock;
  int sock_00;
  int family;
  int sock_01;
  int family_00;
  int sock_02;
  int sock_03;
  int sock_04;
  int family_01;
  int sock_05;
  int family_02;
  int sock_06;
  int family_03;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  int family_04;
  int sock_11;
  int family_05;
  int sock_12;
  int family_06;
  int sock_13;
  int sock_14;
  int sock_15;
  int sock_16;
  int family_07;
  int sock_17;
  int family_08;
  int sock_18;
  int family_09;
  int sock_19;
  int sock_20;
  int sock_21;
  int sock_22;
  char cVar4;
  int in_ESI;
  long lVar5;
  bool bVar6;
  
  iVar1 = test_socket_impl((char *)0x2d,in_ESI,in_EDX,(int)in_RCX);
  test_connect_impl((char *)0x2e,iVar1,sock,in_RCX);
  test_close_impl((char *)0x2f,iVar1,sock_00);
  iVar2 = test_socket_impl((char *)0x32,iVar1,family,(int)in_RCX);
  iVar1 = iVar2;
  test_connect_impl((char *)0x33,iVar2,sock_01,in_RCX);
  nn_sleep(200);
  iVar3 = test_socket_impl((char *)0x38,iVar1,family_00,(int)in_RCX);
  test_bind_impl((char *)0x39,iVar3,sock_02,in_RCX);
  test_send_impl((char *)0x3d,iVar2,0x102115,in_RCX);
  test_recv_impl((char *)0x3e,iVar3,0x102115,in_RCX);
  test_send_impl((char *)0x3f,iVar3,0x102115,in_RCX);
  test_recv_impl((char *)0x40,iVar2,0x102115,in_RCX);
  iVar1 = 100;
  while (bVar6 = iVar1 != 0, iVar1 = iVar1 + -1, bVar6) {
    test_send_impl((char *)0x45,iVar2,0x10213e,in_RCX);
  }
  iVar1 = 100;
  while (bVar6 = iVar1 != 0, iVar1 = iVar1 + -1, bVar6) {
    test_recv_impl((char *)0x48,iVar3,0x10213e,in_RCX);
  }
  __ptr = malloc(10000);
  cVar4 = '0';
  data = (char *)0x0;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 10000) break;
    *(char *)((long)__ptr + lVar5) = cVar4 + (char)((ushort)data / 10) * -10;
    lVar5 = lVar5 + 1;
    cVar4 = cVar4 + '\x01';
    data = (char *)(ulong)((int)data + 1);
  }
  *(undefined1 *)((long)__ptr + 9999) = 0;
  test_send_impl((char *)0x52,iVar2,(int)__ptr,data);
  test_recv_impl((char *)0x53,iVar3,(int)__ptr,data);
  free(__ptr);
  test_close_impl((char *)0x56,iVar2,sock_03);
  test_close_impl((char *)0x57,iVar3,sock_04);
  iVar2 = test_socket_impl((char *)0x5a,iVar3,family_01,(int)data);
  iVar1 = iVar2;
  test_bind_impl((char *)0x5b,iVar2,sock_05,data);
  iVar3 = test_socket_impl((char *)0x5c,iVar1,family_02,(int)data);
  iVar1 = iVar3;
  test_connect_impl((char *)0x5d,iVar3,sock_06,data);
  iVar1 = test_socket_impl((char *)0x5e,iVar1,family_03,(int)data);
  test_connect_impl((char *)0x5f,iVar1,sock_07,data);
  nn_sleep(100);
  test_close_impl((char *)0x61,iVar1,sock_08);
  test_close_impl((char *)0x62,iVar3,sock_09);
  test_close_impl((char *)0x63,iVar2,sock_10);
  iVar2 = test_socket_impl((char *)0x66,iVar2,family_04,(int)data);
  iVar1 = iVar2;
  test_bind_impl((char *)0x67,iVar2,sock_11,data);
  iVar3 = test_socket_impl((char *)0x68,iVar1,family_05,(int)data);
  iVar1 = iVar3;
  test_bind_impl((char *)0x69,iVar3,sock_12,data);
  iVar1 = test_socket_impl((char *)0x6a,iVar1,family_06,(int)data);
  test_connect_impl((char *)0x6b,iVar1,sock_13,data);
  nn_sleep(100);
  test_send_impl((char *)0x6d,iVar2,0x102142,data);
  test_recv_impl((char *)0x6e,iVar1,0x102142,data);
  test_close_impl((char *)0x6f,iVar2,sock_14);
  test_send_impl((char *)0x70,iVar3,0x102142,data);
  test_recv_impl((char *)0x71,iVar1,0x102142,data);
  test_close_impl((char *)0x72,iVar1,sock_15);
  test_close_impl((char *)0x73,iVar3,sock_16);
  iVar2 = test_socket_impl((char *)0x76,iVar3,family_07,(int)data);
  iVar1 = iVar2;
  test_bind_impl((char *)0x77,iVar2,sock_17,data);
  nn_sleep(100);
  iVar3 = test_socket_impl((char *)0x79,iVar1,family_08,(int)data);
  iVar1 = iVar3;
  test_bind_impl((char *)0x7a,iVar3,sock_18,data);
  iVar1 = test_socket_impl((char *)0x7b,iVar1,family_09,(int)data);
  test_connect_impl((char *)0x7c,iVar1,sock_19,data);
  nn_sleep(100);
  test_send_impl((char *)0x7e,iVar2,0x102142,data);
  test_recv_impl((char *)0x7f,iVar1,0x102142,data);
  test_close_impl((char *)0x80,iVar3,sock_20);
  test_send_impl((char *)0x81,iVar2,0x102142,data);
  test_recv_impl((char *)0x82,iVar1,0x102142,data);
  test_close_impl((char *)0x83,iVar2,sock_21);
  test_close_impl((char *)0x84,iVar1,sock_22);
  return 0;
}

Assistant:

int main ()
{
    int sb;
    int sc;
    int i;
    int s1, s2;

    int size;
    char * buf;

    /*  Try closing a IPC socket while it not connected. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    test_close (sc);

    /*  Open the socket anew. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    /*  Leave enough time for at least one re-connect attempt. */
    nn_sleep (200);

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);

    /*  Ping-pong test. */
    for (i = 0; i != 1; ++i) {
        test_send (sc, "0123456789012345678901234567890123456789");
        test_recv (sb, "0123456789012345678901234567890123456789");
        test_send (sb, "0123456789012345678901234567890123456789");
        test_recv (sc, "0123456789012345678901234567890123456789");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "XYZ");
    }

    /*  Send something large enough to trigger overlapped I/O on Windows. */
    size = 10000;
    buf = malloc (size);
    for (i = 0; i < size; ++i) {
        buf[i] = 48 + i % 10;
    }
    buf[size-1] = '\0';
    test_send (sc, buf);
    test_recv (sb, buf);
    free (buf);

    test_close (sc);
    test_close (sb);

    /*  Test whether connection rejection is handled decently. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_connect (s1, SOCKET_ADDRESS);
    s2 = test_socket (AF_SP, NN_PAIR);
    test_connect (s2, SOCKET_ADDRESS);
    nn_sleep (100);
    test_close (s2);
    test_close (s1);
    test_close (sb);

    /*  Test two sockets binding to the same address. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_bind (s1, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    nn_sleep (100);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (sb);
    test_send (s1, "ABC");
    test_recv (sc, "ABC");   
    test_close (sc);
    test_close (s1);

    /*  Test closing a socket that is waiting to bind. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    nn_sleep (100);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_bind (s1, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    nn_sleep (100);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (s1);
    test_send (sb, "ABC");
    test_recv (sc, "ABC");
    test_close (sb);
    test_close (sc);

    return 0;
}